

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O3

void __thiscall omp_tuple_map_pair_one_pair_Test::TestBody(omp_tuple_map_pair_one_pair_Test *this)

{
  char *pcVar1;
  tuple<int,_double> result;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  undefined1 *local_20;
  int local_18 [2];
  
  local_20 = &DAT_401c000000000000;
  local_18[0] = 6;
  local_40._M_head_impl._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"std::get<0>(result)","expected.first + 5",local_18,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0x97,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  else {
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
    local_40._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_401c000000000000;
    testing::internal::CmpHelperEQ<double,double>
              (local_30,"std::get<1>(result)","expected.second + 5",(double *)&local_20,
               (double *)&local_40);
    if (local_30[0] != (internal)0x0) goto LAB_00131330;
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0x98,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
LAB_00131330:
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST(omp_tuple_map_pair, one_pair) {
  auto expected = std::pair(1, 2.0);

  auto result = omp::tuple_map([](auto &val) { return val + 5; }, expected);

  ASSERT_EQ(std::get<0>(result), expected.first + 5);
  ASSERT_EQ(std::get<1>(result), expected.second + 5);
}